

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

JSON __thiscall anon_unknown.dwarf_3a70e::JSONParser::parse(JSONParser *this)

{
  bool bVar1;
  runtime_error *this_00;
  reference pvVar2;
  JSON *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  JSONParser *in_RSI;
  JSON JVar3;
  JSON *tos;
  JSONParser *this_local;
  
  while (((in_RSI->done ^ 0xffU) & 1) != 0) {
    getToken(in_RSI);
    handleToken(in_RSI);
  }
  if (in_RSI->parser_state != ps_done) {
    QTC::TC("libtests","JSON parse premature EOF",0);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"JSON: premature end of input");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar2 = std::
           vector<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
           ::back(&in_RSI->stack);
  this_01 = &pvVar2->item;
  if (in_RSI->reactor != (Reactor *)0x0) {
    bVar1 = JSON::isArray(this_01);
    if (!bVar1) {
      bVar1 = JSON::isDictionary(this_01);
      if (!bVar1) {
        (*in_RSI->reactor->_vptr_Reactor[5])();
      }
    }
  }
  JSON::JSON((JSON *)this,this_01);
  JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar3.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSONParser::parse()
{
    while (!done) {
        getToken();
        handleToken();
    }
    if (parser_state != ps_done) {
        QTC::TC("libtests", "JSON parse premature EOF");
        throw std::runtime_error("JSON: premature end of input");
    }
    auto const& tos = stack.back().item;
    if (reactor && !(tos.isArray() || tos.isDictionary())) {
        reactor->topLevelScalar();
    }
    return tos;
}